

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O3

bool getScriptFromDescriptor(string *descriptor,CScript *script,string *error)

{
  char cVar1;
  UniValue *pUVar2;
  undefined8 uVar3;
  ulong uVar4;
  char unaff_BPL;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  long in_FS_OFFSET;
  vector<CScript,_std::allocator<CScript>_> scripts;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  descs;
  FlatSigningProvider provider;
  FlatSigningProvider key_provider;
  vector<CScript,_std::allocator<CScript>_> local_278;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  local_258;
  string local_240;
  undefined1 local_220 [16];
  _Rb_tree_node_base local_210;
  size_t local_1f0;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  local_1e8;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  local_1b8;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_188;
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  local_158;
  FlatSigningProvider local_128;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_128.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  local_128.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_01399da8;
  local_128.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_128.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128.origins._M_t._M_impl.super__Rb_tree_header._M_header;
  local_128.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_128.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
  local_128.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_128.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_128.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_128.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_128.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Parse(&local_258,descriptor,&local_128,error,false);
  if (local_258.
      super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_258.
      super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00a1f55d:
    std::
    vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
    ::~vector(&local_258);
    std::
    _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
    ::~_Rb_tree(&local_128.tr_trees._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::~_Rb_tree(&local_128.keys._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
    ::~_Rb_tree(&local_128.origins._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
    ::~_Rb_tree(&local_128.pubkeys._M_t);
    std::
    _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
    ::~_Rb_tree(&local_128.scripts._M_t);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return local_258.
             super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_258.
             super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  else {
    if (1 < (ulong)((long)local_258.
                          super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_258.
                          super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
      local_220._0_8_ = &local_210;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_220,"Multipath descriptor not accepted","");
      JSONRPCError(pUVar2,-8,(string *)local_220);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_00a1f860;
    }
    if ((long)local_258.
              super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_258.
              super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 8) {
      cVar1 = (**(code **)(**(long **)local_258.
                                      super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 0x10))();
      if (cVar1 == '\0') {
        local_210._M_left = &local_210;
        local_220._0_8_ = &PTR__FlatSigningProvider_01399da8;
        local_210._M_color = _S_red;
        local_210._M_parent = (_Base_ptr)0x0;
        local_1f0 = 0;
        local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_1e8._M_impl.super__Rb_tree_header._M_header;
        local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_1b8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_1b8._M_impl.super__Rb_tree_header._M_header;
        local_1b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_1b8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_188._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_188._M_impl.super__Rb_tree_header._M_header;
        local_188._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_188._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_188._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_158._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_158._M_impl.super__Rb_tree_header._M_header;
        local_158._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_158._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_278.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_278.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_278.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_210._M_right = local_210._M_left;
        local_1e8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
        local_1b8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
        local_188._M_impl.super__Rb_tree_header._M_header._M_right =
             local_188._M_impl.super__Rb_tree_header._M_header._M_left;
        local_158._M_impl.super__Rb_tree_header._M_header._M_right =
             local_158._M_impl.super__Rb_tree_header._M_header._M_left;
        cVar1 = (**(code **)(**(long **)local_258.
                                        super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 0x40))
                          (*(long **)local_258.
                                     super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,0,&local_128,
                           &local_278,local_220,0);
        if (cVar1 == '\0') {
          pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
          local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_240,"Cannot derive script without private keys","");
          JSONRPCError(pUVar2,-5,&local_240);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
            __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00a1f860;
        }
        local_240._M_dataplus._M_p._0_1_ =
             (ulong)((long)local_278.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)local_278.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                          super__Vector_impl_data._M_start) < 0x81 &&
             local_278.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             local_278.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
             super__Vector_impl_data._M_start;
        inline_check_non_fatal<bool>
                  ((bool *)&local_240,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mining.cpp"
                   ,200,"getScriptFromDescriptor","scripts.size() > 0 && scripts.size() <= 4");
        uVar4 = (long)local_278.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_278.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                      super__Vector_impl_data._M_start >> 5;
        other = &(local_278.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                  super__Vector_impl_data._M_start)->super_CScriptBase;
        if (uVar4 != 1) {
          if (uVar4 == 4) {
            other = &local_278.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                     super__Vector_impl_data._M_start[2].super_CScriptBase;
          }
          else {
            if (uVar4 < 2) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
                uVar3 = std::__throw_out_of_range_fmt
                                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                   ,1);
                if ((pointer)local_240._M_dataplus._M_p !=
                    local_258.
                    super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  operator_delete(local_240._M_dataplus._M_p,
                                  local_240.field_2._M_allocated_capacity + 1);
                }
                if (unaff_BPL != '\0') {
                  __cxa_free_exception
                            (local_258.
                             super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
                }
                std::vector<CScript,_std::allocator<CScript>_>::~vector(&local_278);
                FlatSigningProvider::~FlatSigningProvider((FlatSigningProvider *)local_220);
                std::
                vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                ::~vector(&local_258);
                FlatSigningProvider::~FlatSigningProvider(&local_128);
                if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
                  _Unwind_Resume(uVar3);
                }
              }
              goto LAB_00a1f860;
            }
            other = &local_278.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                     super__Vector_impl_data._M_start[1].super_CScriptBase;
          }
        }
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&script->super_CScriptBase,other);
        std::vector<CScript,_std::allocator<CScript>_>::~vector(&local_278);
        std::
        _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
        ::~_Rb_tree(&local_158);
        std::
        _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
        ::~_Rb_tree(&local_188);
        std::
        _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
        ::~_Rb_tree(&local_1b8);
        std::
        _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
        ::~_Rb_tree(&local_1e8);
        std::
        _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
        ::~_Rb_tree((_Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                     *)(local_220 + 8));
        goto LAB_00a1f55d;
      }
    }
    else {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_00a1f860;
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0);
    }
    pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
    local_220._0_8_ = &local_210;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_220,
               "Ranged descriptor not accepted. Maybe pass through deriveaddresses first?","");
    JSONRPCError(pUVar2,-8,(string *)local_220);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
LAB_00a1f860:
  __stack_chk_fail();
}

Assistant:

static bool getScriptFromDescriptor(const std::string& descriptor, CScript& script, std::string& error)
{
    FlatSigningProvider key_provider;
    const auto descs = Parse(descriptor, key_provider, error, /* require_checksum = */ false);
    if (descs.empty()) return false;
    if (descs.size() > 1) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Multipath descriptor not accepted");
    }
    const auto& desc = descs.at(0);
    if (desc->IsRange()) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Ranged descriptor not accepted. Maybe pass through deriveaddresses first?");
    }

    FlatSigningProvider provider;
    std::vector<CScript> scripts;
    if (!desc->Expand(0, key_provider, scripts, provider)) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Cannot derive script without private keys");
    }

    // Combo descriptors can have 2 or 4 scripts, so we can't just check scripts.size() == 1
    CHECK_NONFATAL(scripts.size() > 0 && scripts.size() <= 4);

    if (scripts.size() == 1) {
        script = scripts.at(0);
    } else if (scripts.size() == 4) {
        // For uncompressed keys, take the 3rd script, since it is p2wpkh
        script = scripts.at(2);
    } else {
        // Else take the 2nd script, since it is p2pkh
        script = scripts.at(1);
    }

    return true;
}